

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O3

void __thiscall multisig_tests::multisig_verify::test_method(multisig_verify *this)

{
  int iVar1;
  pointer tx;
  uint uVar2;
  undefined8 *puVar3;
  uint uVar4;
  size_type sVar5;
  void *pvVar6;
  string *psVar7;
  bool bVar8;
  long lVar9;
  CScript *pCVar10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  uchar *in;
  pointer *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar12;
  iterator in_R8;
  iterator pvVar13;
  CTransaction *pCVar14;
  iterator in_R9;
  iterator pvVar15;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  vector<CKey,_std::allocator<CKey>_> keys;
  ScriptError err;
  CMutableTransaction txTo [3];
  CMutableTransaction txFrom;
  CKey key [4];
  char *in_stack_fffffffffffffa10;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  int local_52c;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  uint local_32c;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  vector<CKey,_std::allocator<CKey>_> local_2c8;
  ScriptError local_2ac;
  string local_2a8;
  CTransaction local_288;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [28];
  uint uStack_1cc;
  undefined1 local_1c8 [112];
  undefined1 local_158 [56];
  undefined1 local_120 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_108 [2];
  undefined1 local_d8 [28];
  uint uStack_bc;
  undefined1 local_b8 [28];
  uint uStack_9c;
  undefined1 local_98 [28];
  uint uStack_7c;
  CKey local_78 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = 0;
  do {
    (&local_78[0].fCompressed)[lVar9] = false;
    *(undefined8 *)
     ((long)&local_78[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
     + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  lVar9 = 0;
  do {
    CKey::MakeNewKey((CKey *)(&local_78[0].fCompressed + lVar9),true);
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  local_98._16_8_ = 0;
  stack0xffffffffffffff80 = 0;
  local_98._0_8_ = (char *)0x0;
  local_98._8_8_ = 0;
  local_1c8[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,(iterator)local_98,
             local_1c8);
  CKey::GetPubKey((CPubKey *)local_1c8,local_78);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,(CPubKey *)local_1c8
            );
  pCVar10 = CScript::operator<<((CScript *)local_98,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  CKey::GetPubKey((CPubKey *)&local_288,local_78 + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,(CPubKey *)&local_288
            );
  ppVar11 = &CScript::operator<<(pCVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_b8)->super_CScriptBase;
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_d8[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),local_d8);
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_d8[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),local_d8);
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ - local_120._0_8_);
  }
  local_b8._16_8_ = (pointer)0x0;
  stack0xffffffffffffff60 = 0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_1c8[0] = 'Q';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8,(iterator)local_b8,
             local_1c8);
  CKey::GetPubKey((CPubKey *)local_1c8,local_78);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,(CPubKey *)local_1c8
            );
  pCVar10 = CScript::operator<<((CScript *)local_b8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  CKey::GetPubKey((CPubKey *)&local_288,local_78 + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,(CPubKey *)&local_288
            );
  ppVar11 = &CScript::operator<<(pCVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_d8)->super_CScriptBase;
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_1e8[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),local_1e8);
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_1e8[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),local_1e8);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ - local_120._0_8_);
  }
  local_d8._16_8_ = (pointer)0x0;
  stack0xffffffffffffff40 = 0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_1c8[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_d8,(iterator)local_d8,
             local_1c8);
  CKey::GetPubKey((CPubKey *)local_1c8,local_78);
  in = local_1c8;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,(CPubKey *)in);
  pCVar10 = CScript::operator<<((CScript *)local_d8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
  CKey::GetPubKey((CPubKey *)&local_288,local_78 + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,
             (CPubKey *)&local_288);
  pCVar10 = CScript::operator<<(pCVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        local_208);
  CKey::GetPubKey((CPubKey *)local_120,local_78 + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8,
             (CPubKey *)local_120);
  ppVar11 = &CScript::operator<<(pCVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_2a8)->super_CScriptBase;
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
  ._0_1_ = 0x53;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),(uchar *)&local_2c8);
  uVar2 = ppVar11->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar11->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar12 = ppVar11;
  }
  local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0xae);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar11,(uchar *)((long)&ppVar12->_union + (long)(int)uVar4),(uchar *)&local_2c8);
  pvVar6 = (void *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,local_2a8.field_2._M_allocated_capacity - (long)pvVar6);
  }
  if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
      (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0) {
    operator_delete((void *)local_208._0_8_,
                    CONCAT44(local_1f8._4_4_,local_1f8._0_4_) - local_208._0_8_);
  }
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,
                    CONCAT44(local_1e8._20_4_,local_1e8._16_4_) - local_1e8._0_8_);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_120);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(local_108,3);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_108[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&local_108[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&local_108[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  lVar9 = 0;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)(local_1c8 + lVar9));
    lVar9 = lVar9 + 0x38;
  } while (lVar9 != 0xa8);
  lVar9 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(in + 0x18),1);
    *(int *)(*(long *)in + 0x20) = (int)lVar9;
    CMutableTransaction::GetHash((Txid *)&local_288,(CMutableTransaction *)local_120);
    puVar3 = *(undefined8 **)in;
    puVar3[2] = local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    puVar3[3] = local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
    *puVar3 = local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3[1] = local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
    **(undefined8 **)(in + 0x18) = 1;
    lVar9 = lVar9 + 1;
    in = in + 0x38;
  } while (lVar9 != 3);
  local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8._16_4_ = 0;
  local_1e8._20_4_ = 0;
  local_1e8._24_4_ = 0;
  uStack_1cc = 0;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_4_ = 0;
  local_1e8._12_4_ = 0;
  std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&local_2c8,1,local_78);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_2c8,local_78 + 1);
  CTransaction::CTransaction(&local_288,(CMutableTransaction *)local_1c8);
  sign_multisig((CScript *)local_208,(CScript *)local_98,&local_2c8,&local_288,(int)in_R8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._16_4_ = local_1f8._0_4_;
  local_1e8._20_4_ = local_1f8._4_4_;
  local_1e8._24_4_ = local_1f8._8_4_;
  local_1e8._0_8_ = local_208._0_8_;
  local_1e8._8_4_ = local_208._8_4_;
  uStack_1cc = local_1f8._12_4_;
  local_1f8._12_4_ = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_288.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_288.vin);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000050;
  file.m_begin = (iterator)&local_2d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e8,msg);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_1c8;
  local_2a8._M_dataplus._M_p._0_1_ =
       VerifyScript((CScript *)local_1e8,(CScript *)local_98,(CScriptWitness *)0x0,3,
                    (BaseSignatureChecker *)&local_288,&local_2ac);
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_1f8._8_8_ = local_368;
  local_368._0_8_ =
       "VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_368._8_8_ = "";
  local_208._8_4_ = local_208._8_4_ & 0xffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_1f8._0_4_ = 0x13c2138;
  local_1f8._4_4_ = 0;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_2f0 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)local_208,1,0,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_2f8,0x50);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x51;
  file_00.m_begin = (iterator)&local_308;
  msg_00.m_end = pvVar15;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
             msg_00);
  local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_OK;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013adf88;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_320 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x1;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_328,0x51);
  if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
      (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
    operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_32c = 0;
  do {
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&local_2c8,1,local_78 + (int)local_32c)
    ;
    CTransaction::CTransaction(&local_288,(CMutableTransaction *)local_1c8);
    sign_multisig((CScript *)local_208,(CScript *)local_98,&local_2c8,&local_288,(int)pvVar13);
    psVar7 = (string *)local_1f8._8_8_;
    if ((string *)0x1cffffffff < stack0xfffffffffffffe30) {
      free((void *)local_1e8._0_8_);
      psVar7 = (string *)local_1f8._8_8_;
    }
    local_1f8._8_4_ = SUB84(psVar7,0);
    local_1e8._16_4_ = local_1f8._0_4_;
    local_1e8._20_4_ = local_1f8._4_4_;
    local_1e8._0_8_ = local_208._0_8_;
    local_1e8._8_4_ = local_208._8_4_;
    local_1f8._12_4_ = 0;
    unique0x10003123 = psVar7;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_288.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_288.vin);
    local_340 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_338 = "";
    aStack_358._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x57;
    file_01.m_begin = (iterator)&local_340;
    msg_01.m_end = pvVar15;
    msg_01.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
               (size_t)(local_368 + 0x18),msg_01);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c8;
    bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_98,(CScriptWitness *)0x0,3,
                         (BaseSignatureChecker *)&local_288,&local_2ac);
    local_368[0] = !bVar8;
    local_368._8_8_ = (element_type *)0x0;
    aStack_358._M_allocated_capacity = 0;
    tinyformat::format<int>(&local_2a8,"a&b 1: %d",(int *)&local_32c);
    local_208._8_4_ = local_208._8_4_ & 0xffffff00;
    local_208._0_8_ = &PTR__lazy_ostream_013adf88;
    local_1f8._0_4_ = 0x13c2138;
    local_1f8._4_4_ = 0;
    local_378 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_370 = "";
    pvVar13 = (iterator)0x1;
    pvVar15 = (iterator)0x1;
    local_1f8._8_8_ = &local_2a8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_378,0x57);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
        &local_2a8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_)
                      ,local_2a8.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = &DAT_00000058;
    file_02.m_begin = (iterator)&local_388;
    msg_02.m_end = pvVar15;
    msg_02.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_398,
               msg_02);
    local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_INVALID_STACK_OPERATION;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = 0;
    ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013adf88;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3a0 = "";
    pvVar13 = (iterator)0x1;
    pvVar15 = (iterator)0x1;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_3a8,0x58);
    if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
        (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
      operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
    }
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&local_2c8,1,local_78 + 1);
    std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_2c8,local_78 + (int)local_32c);
    CTransaction::CTransaction(&local_288,(CMutableTransaction *)local_1c8);
    sign_multisig((CScript *)local_208,(CScript *)local_98,&local_2c8,&local_288,(int)pvVar13);
    psVar7 = (string *)local_1f8._8_8_;
    if ((string *)0x1cffffffff < stack0xfffffffffffffe30) {
      free((void *)local_1e8._0_8_);
      psVar7 = (string *)local_1f8._8_8_;
    }
    local_1f8._8_4_ = SUB84(psVar7,0);
    local_1e8._16_4_ = local_1f8._0_4_;
    local_1e8._20_4_ = local_1f8._4_4_;
    local_1e8._0_8_ = local_208._0_8_;
    local_1e8._8_4_ = local_208._8_4_;
    local_1f8._12_4_ = 0;
    unique0x10003143 = psVar7;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_288.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_288.vin);
    local_3b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3b0 = "";
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x5d;
    file_03.m_begin = (iterator)&local_3b8;
    msg_03.m_end = pvVar15;
    msg_03.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c8,
               msg_03);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c8;
    bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_98,(CScriptWitness *)0x0,3,
                         (BaseSignatureChecker *)&local_288,&local_2ac);
    local_368[0] = !bVar8;
    local_368._8_8_ = (element_type *)0x0;
    aStack_358._M_allocated_capacity = 0;
    tinyformat::format<int>(&local_2a8,"a&b 2: %d",(int *)&local_32c);
    local_208._8_4_ = local_208._8_4_ & 0xffffff00;
    local_208._0_8_ = &PTR__lazy_ostream_013adf88;
    local_1f8._0_4_ = 0x13c2138;
    local_1f8._4_4_ = 0;
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3d0 = "";
    pvVar13 = (iterator)0x1;
    pvVar15 = (iterator)0x1;
    local_1f8._8_8_ = &local_2a8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_3d8,0x5d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
        &local_2a8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_)
                      ,local_2a8.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
    local_3e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x5e;
    file_04.m_begin = (iterator)&local_3e8;
    msg_04.m_end = pvVar15;
    msg_04.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3f8,
               msg_04);
    local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_EVAL_FALSE;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = 0;
    ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013adf88;
    local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_408 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_400 = "";
    pvVar13 = (iterator)0x1;
    pvVar15 = (iterator)0x1;
    local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
               (check_type)in_stack_fffffffffffffa10,(size_t)&local_408,0x5e);
    if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
        (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
      operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
    }
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    bVar8 = (int)local_32c < 3;
    local_32c = local_32c + 1;
  } while (bVar8);
  local_32c = 0;
  tx = (pointer)(local_1c8 + 0x38);
  do {
    std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign(&local_2c8,1,local_78 + (int)local_32c)
    ;
    CTransaction::CTransaction(&local_288,(CMutableTransaction *)tx);
    sign_multisig((CScript *)local_208,(CScript *)local_b8,&local_2c8,&local_288,(int)pvVar13);
    psVar7 = (string *)local_1f8._8_8_;
    if ((string *)0x1cffffffff < stack0xfffffffffffffe30) {
      free((void *)local_1e8._0_8_);
      psVar7 = (string *)local_1f8._8_8_;
    }
    local_1f8._8_4_ = SUB84(psVar7,0);
    local_1e8._16_4_ = local_1f8._0_4_;
    local_1e8._20_4_ = local_1f8._4_4_;
    local_1e8._0_8_ = local_208._0_8_;
    local_1e8._8_4_ = local_208._8_4_;
    local_1f8._12_4_ = 0;
    unique0x1000317b = psVar7;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_288.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_288.vin);
    if (local_32c < 2) {
      local_418 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_410 = "";
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      local_420 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = &DAT_00000068;
      file_05.m_begin = (iterator)&local_418;
      msg_05.m_end = pvVar15;
      msg_05.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_428,
                 msg_05);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = tx;
      bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_b8,(CScriptWitness *)0x0,3,
                           (BaseSignatureChecker *)&local_288,&local_2ac);
      local_368[0] = bVar8;
      local_368._8_8_ = (element_type *)0x0;
      aStack_358._M_allocated_capacity = 0;
      tinyformat::format<int>(&local_2a8,"a|b: %d",(int *)&local_32c);
      local_208._8_4_ = local_208._8_4_ & 0xffffff00;
      local_208._0_8_ = &PTR__lazy_ostream_013adf88;
      local_1f8._0_4_ = 0x13c2138;
      local_1f8._4_4_ = 0;
      local_438 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_430 = "";
      pvVar13 = (iterator)0x1;
      pvVar15 = (iterator)0x1;
      local_1f8._8_8_ = &local_2a8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_438,0x68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
          &local_2a8.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                    local_2a8._M_dataplus._M_p._0_1_),
                        local_2a8.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
      local_448 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_440 = "";
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x69;
      file_06.m_begin = (iterator)&local_448;
      msg_06.m_end = pvVar15;
      msg_06.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_458,
                 msg_06);
      local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_OK;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_468 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_460 = "";
      pvVar13 = (iterator)0x1;
      pvVar15 = (iterator)0x1;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_468,0x69);
    }
    else {
      local_478 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_470 = "";
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      local_480 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x6d;
      file_07.m_begin = (iterator)&local_478;
      msg_07.m_end = pvVar15;
      msg_07.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_488,
                 msg_07);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = tx;
      bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_b8,(CScriptWitness *)0x0,3,
                           (BaseSignatureChecker *)&local_288,&local_2ac);
      local_368[0] = !bVar8;
      local_368._8_8_ = (element_type *)0x0;
      aStack_358._M_allocated_capacity = 0;
      tinyformat::format<int>(&local_2a8,"a|b: %d",(int *)&local_32c);
      local_208._8_4_ = local_208._8_4_ & 0xffffff00;
      local_208._0_8_ = &PTR__lazy_ostream_013adf88;
      local_1f8._0_4_ = 0x13c2138;
      local_1f8._4_4_ = 0;
      local_498 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_490 = "";
      pvVar13 = (iterator)0x1;
      pvVar15 = (iterator)0x1;
      local_1f8._8_8_ = &local_2a8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_498,0x6d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
          &local_2a8.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                    local_2a8._M_dataplus._M_p._0_1_),
                        local_2a8.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
      local_4a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_4a0 = "";
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x6e;
      file_08.m_begin = (iterator)&local_4a8;
      msg_08.m_end = pvVar15;
      msg_08.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4b8,
                 msg_08);
      local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_EVAL_FALSE;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
      local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_4c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
      ;
      local_4c0 = "";
      pvVar13 = (iterator)0x1;
      pvVar15 = (iterator)0x1;
      local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                 (check_type)in_stack_fffffffffffffa10,(size_t)&local_4c8,0x6e);
    }
    if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
        (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
      operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
    }
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
    uVar2 = local_32c + 1;
    bVar8 = (int)local_32c < 3;
    local_32c = uVar2;
  } while (bVar8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,0);
  sVar5 = uStack_1cc - 0x1d;
  if (stack0xfffffffffffffe30 < (string *)0x1d00000000) {
    sVar5 = uStack_1cc;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,sVar5);
  ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8._0_8_;
  sVar5 = uStack_1cc - 0x1d;
  if (stack0xfffffffffffffe30 < (string *)0x1d00000000) {
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8;
    sVar5 = uStack_1cc;
  }
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
             (uchar *)((long)&ppVar11->_union + (long)(int)sVar5),(uchar *)&local_288);
  ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8._0_8_;
  sVar5 = uStack_1cc - 0x1d;
  if (stack0xfffffffffffffe30 < (string *)0x1d00000000) {
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8;
    sVar5 = uStack_1cc;
  }
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
             (uchar *)((long)&ppVar11->_union + (long)(int)sVar5),(uchar *)&local_288);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x73;
  file_09.m_begin = (iterator)&local_4d8;
  msg_09.m_end = pvVar15;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4e8,
             msg_09);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = tx;
  bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_b8,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)&local_288,&local_2ac);
  local_2a8._M_dataplus._M_p._0_1_ = !bVar8;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_368._0_8_ =
       "!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_368._8_8_ = "";
  local_208._8_4_ = local_208._8_4_ & 0xffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_1f8._0_4_ = 0x13c2138;
  local_1f8._4_4_ = 0;
  local_1f8._8_8_ = local_368;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_4f0 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)local_208,1,0,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_4f8,0x73);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x74;
  file_10.m_begin = (iterator)&local_508;
  msg_10.m_end = pvVar15;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_518,
             msg_10);
  local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_SIG_DER;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013adf88;
  local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
  ;
  local_520 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x1;
  local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
             (check_type)in_stack_fffffffffffffa10,(size_t)&local_528,0x74);
  if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
      (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
    operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
  local_32c = 0;
  do {
    local_52c = 0;
    do {
      std::vector<CKey,_std::allocator<CKey>_>::_M_fill_assign
                (&local_2c8,1,local_78 + (int)local_32c);
      std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_2c8,local_78 + local_52c);
      CTransaction::CTransaction(&local_288,(CMutableTransaction *)local_158);
      sign_multisig((CScript *)local_208,(CScript *)local_d8,&local_2c8,&local_288,(int)pvVar13);
      psVar7 = (string *)local_1f8._8_8_;
      if ((string *)0x1cffffffff < stack0xfffffffffffffe30) {
        free((void *)local_1e8._0_8_);
        psVar7 = (string *)local_1f8._8_8_;
      }
      local_1f8._8_4_ = SUB84(psVar7,0);
      local_1e8._16_4_ = local_1f8._0_4_;
      local_1e8._20_4_ = local_1f8._4_4_;
      local_1e8._0_8_ = local_208._0_8_;
      local_1e8._8_4_ = local_208._8_4_;
      local_1f8._12_4_ = 0;
      unique0x1000315b = psVar7;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_288.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_288.vin);
      local_1f8._8_8_ = &local_2a8;
      if (((local_52c < 3) && ((int)local_32c < 3)) && ((int)local_32c < local_52c)) {
        local_540 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_538 = "";
        local_550 = &boost::unit_test::basic_cstring<char_const>::null;
        local_548 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0x7f;
        file_11.m_begin = (iterator)&local_540;
        msg_11.m_end = pvVar15;
        msg_11.m_begin = pvVar13;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_550
                   ,msg_11);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pCVar14 = &local_288;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_158;
        bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_d8,(CScriptWitness *)0x0,3,
                             (BaseSignatureChecker *)&local_288,&local_2ac);
        local_368[0] = bVar8;
        local_368._8_8_ = (element_type *)0x0;
        aStack_358._M_allocated_capacity = 0;
        tinyformat::format<int,int>
                  (&local_2a8,(tinyformat *)"escrow 1: %d %d",(char *)&local_32c,&local_52c,
                   (int *)pCVar14);
        local_208._8_4_ = local_208._8_4_ & 0xffffff00;
        local_208._0_8_ = &PTR__lazy_ostream_013adf88;
        local_1f8._0_4_ = 0x13c2138;
        local_1f8._4_4_ = 0;
        local_560 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_558 = "";
        pvVar13 = (iterator)0x1;
        pvVar15 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_560,0x7f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
            &local_2a8.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                      local_2a8._M_dataplus._M_p._0_1_),
                          local_2a8.field_2._M_allocated_capacity + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
        local_570 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_568 = "";
        local_580 = &boost::unit_test::basic_cstring<char_const>::null;
        local_578 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0x80;
        file_12.m_begin = (iterator)&local_570;
        msg_12.m_end = pvVar15;
        msg_12.m_begin = pvVar13;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_580
                   ,msg_12);
        local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_OK;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_allocated_capacity = 0;
        ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_590 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_588 = "";
        pvVar13 = (iterator)0x1;
        pvVar15 = (iterator)0x1;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_208;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_590,0x80);
      }
      else {
        local_5a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_598 = "";
        local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_13.m_end = (iterator)0x84;
        file_13.m_begin = (iterator)&local_5a0;
        msg_13.m_end = pvVar15;
        msg_13.m_begin = pvVar13;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b0
                   ,msg_13);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_013b06d0;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pCVar14 = &local_288;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_158;
        bVar8 = VerifyScript((CScript *)local_1e8,(CScript *)local_d8,(CScriptWitness *)0x0,3,
                             (BaseSignatureChecker *)&local_288,&local_2ac);
        local_368[0] = !bVar8;
        local_368._8_8_ = (element_type *)0x0;
        aStack_358._M_allocated_capacity = 0;
        tinyformat::format<int,int>
                  (&local_2a8,(tinyformat *)"escrow 2: %d %d",(char *)&local_32c,&local_52c,
                   (int *)pCVar14);
        local_208._8_4_ = local_208._8_4_ & 0xffffff00;
        local_208._0_8_ = &PTR__lazy_ostream_013adf88;
        local_1f8._0_4_ = 0x13c2138;
        local_1f8._4_4_ = 0;
        local_5c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_5b8 = "";
        pvVar13 = (iterator)0x1;
        pvVar15 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_368,(lazy_ostream *)local_208,1,1,WARN,
                   (check_type)in_stack_fffffffffffffa10,(size_t)&local_5c0,0x84);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,local_2a8._M_dataplus._M_p._0_1_) !=
            &local_2a8.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                      local_2a8._M_dataplus._M_p._0_1_),
                          local_2a8.field_2._M_allocated_capacity + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_368 + 0x10));
        local_5d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        local_5c8 = "";
        local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_14.m_end = (iterator)0x85;
        file_14.m_begin = (iterator)&local_5d0;
        msg_14.m_end = pvVar15;
        msg_14.m_begin = pvVar13;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5e0
                   ,msg_14);
        local_2a8._M_dataplus._M_p._0_1_ = local_2ac == SCRIPT_ERR_EVAL_FALSE;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_allocated_capacity = 0;
        ScriptErrorString_abi_cxx11_((string *)local_208,local_2ac);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
        local_288.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        in_stack_fffffffffffffa10 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
        ;
        pvVar13 = (iterator)0x1;
        pvVar15 = (iterator)0x1;
        local_288.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_208;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_2a8,(lazy_ostream *)&local_288,1,1,WARN,0xeb3a1f,
                   (size_t)&stack0xfffffffffffffa10,0x85);
      }
      if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208._0_8_ !=
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1f8) {
        operator_delete((void *)local_208._0_8_,CONCAT44(local_1f8._4_4_,local_1f8._0_4_) + 1);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_2a8.field_2._M_allocated_capacity);
      iVar1 = local_52c + 1;
      bVar8 = local_52c < 3;
      local_52c = iVar1;
    } while (bVar8);
    uVar2 = local_32c + 1;
    bVar8 = (int)local_32c < 3;
    local_32c = uVar2;
  } while (bVar8);
  if ((string *)0x1cffffffff < stack0xfffffffffffffe30) {
    free((void *)local_1e8._0_8_);
  }
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_2c8);
  lVar9 = -0xa8;
  this_00 = (pointer *)(local_158 + 0x18);
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(this_00 + -3));
    this_00 = this_00 + -7;
    lVar9 = lVar9 + 0x38;
  } while (lVar9 != 0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_108);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_120);
  if (0x1c < uStack_bc) {
    free((void *)local_d8._0_8_);
  }
  if (0x1c < uStack_9c) {
    free((void *)local_b8._0_8_);
  }
  if (0x1c < uStack_7c) {
    free((void *)local_98._0_8_);
  }
  lVar9 = 0x38;
  do {
    if (*(array<unsigned_char,_32UL> **)(&local_78[0].fCompressed + lVar9) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&local_78[0].fCompressed + lVar9),
                 *(array<unsigned_char,_32UL> **)(&local_78[0].fCompressed + lVar9));
    }
    *(undefined8 *)(&local_78[0].fCompressed + lVar9) = 0;
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_verify)
{
    unsigned int flags = SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_STRICTENC;

    ScriptError err;
    CKey key[4];
    CAmount amount = 0;
    for (int i = 0; i < 4; i++)
        key[i].MakeNewKey(true);

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    std::vector<CKey> keys;
    CScript s;

    // Test a AND b:
    keys.assign(1,key[0]);
    keys.push_back(key[1]);
    s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
    BOOST_CHECK(VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 1: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));

        keys.assign(1,key[1]);
        keys.push_back(key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 2: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
    }

    // Test a OR b:
    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_or_b, keys, CTransaction(txTo[1]), 0);
        if (i == 0 || i == 1)
        {
            BOOST_CHECK_MESSAGE(VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
        }
        else
        {
            BOOST_CHECK_MESSAGE(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
        }
    }
    s.clear();
    s << OP_0 << OP_1;
    BOOST_CHECK(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_SIG_DER, ScriptErrorString(err));


    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
        {
            keys.assign(1,key[i]);
            keys.push_back(key[j]);
            s = sign_multisig(escrow, keys, CTransaction(txTo[2]), 0);
            if (i < j && i < 3 && j < 3)
            {
                BOOST_CHECK_MESSAGE(VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 1: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
            }
            else
            {
                BOOST_CHECK_MESSAGE(!VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 2: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
            }
        }
}